

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

Variable __thiscall runtime::VirtualMachine::popOpStack(VirtualMachine *this)

{
  element_type *peVar1;
  pointer pVVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  Variable VVar4;
  string local_38;
  
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"No active stack frame found to pop op stack from!","");
    panic(this,&local_38);
  }
  pVVar2 = (peVar1->opStack).
           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((peVar1->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
      _M_impl.super__Vector_impl_data._M_start != pVVar2) {
    VVar4._4_4_ = 0;
    VVar4.type = pVVar2[-1].type;
    aVar3 = (anon_union_8_6_52c89740_for_Variable_1)pVVar2[-1].field_1.integerValue;
    (peVar1->opStack).super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2 + -1;
    VVar4.field_1 =
         (anon_union_8_6_52c89740_for_Variable_1)
         (anon_union_8_6_52c89740_for_Variable_1)aVar3.integerValue;
    return VVar4;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Could not pop op stack, it is empty!","");
  panic(this,&local_38);
}

Assistant:

Variable runtime::VirtualMachine::popOpStack() {
  if (this->stackFrame == nullptr) {
    this->panic("No active stack frame found to pop op stack from!");
  }

  auto opStack = &this->stackFrame->opStack;

  if (opStack->empty()) {
    this->panic("Could not pop op stack, it is empty!");

  } else {
    Variable topOfStack = opStack->at(opStack->size() - 1);
    opStack->pop_back();

    return topOfStack;
  }
}